

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cg-dump.cpp
# Opt level: O2

void dumpCallGraph(CallGraph *CG)

{
  pointer ppFVar1;
  pointer ppFVar2;
  ostream *poVar3;
  pointer ppFVar4;
  StringRef SVar5;
  StringRef local_c0;
  StringRef local_b0;
  _Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_a0;
  _Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_88;
  string local_70;
  string local_50;
  
  std::operator<<((ostream *)&std::cout,"digraph CallGraph {\n");
  (*((CG->_impl)._M_t.
     super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
     ._M_t.
     super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
     .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl)->_vptr_CallGraphImpl
    [2])(&local_88);
  for (ppFVar2 = local_88._M_impl.super__Vector_impl_data._M_start;
      ppFVar2 != local_88._M_impl.super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
    (*((CG->_impl)._M_t.
       super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
       .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl)->_vptr_CallGraphImpl
      [4])(&local_a0);
    ppFVar1 = local_a0._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar4 = local_a0._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar1;
        ppFVar4 = ppFVar4 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"  \"");
      SVar5 = (StringRef)llvm::Value::getName();
      local_b0 = SVar5;
      llvm::StringRef::str_abi_cxx11_(&local_50,&local_b0);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      poVar3 = std::operator<<(poVar3,"\" -> \"");
      SVar5 = (StringRef)llvm::Value::getName();
      local_c0 = SVar5;
      llvm::StringRef::str_abi_cxx11_(&local_70,&local_c0);
      poVar3 = std::operator<<(poVar3,(string *)&local_70);
      std::operator<<(poVar3,"\"\n");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
    ~_Vector_base(&local_a0);
  }
  std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~_Vector_base
            (&local_88);
  std::operator<<((ostream *)&std::cout,"}\n");
  return;
}

Assistant:

static void dumpCallGraph(llvmdg::CallGraph &CG) {
    std::cout << "digraph CallGraph {\n";

    for (const auto *f : CG.functions()) {
        for (const auto *c : CG.callees(f)) {
            std::cout << "  \"" << f->getName().str() << "\" -> \""
                      << c->getName().str() << "\"\n";
        }
    }

    std::cout << "}\n";
}